

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O0

QString * CPP::WriteInitialization::domColor2QString(DomColor *c)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  DomColor *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  int in_stack_fffffffffffffedc;
  int in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 in_stack_fffffffffffffefc;
  QChar QVar7;
  QChar local_de;
  QChar local_dc;
  QChar local_da;
  storage_type *local_d8;
  undefined1 local_c8 [72];
  QChar local_80;
  QChar local_7e;
  QChar local_7c;
  QChar local_7a;
  storage_type *local_78;
  undefined1 local_68 [96];
  long local_8;
  
  QVar7.ucs = (char16_t)((uint)in_stack_fffffffffffffefc >> 0x10);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = DomColor::hasAttributeAlpha(in_RSI);
  if (bVar1) {
    QByteArrayView::QByteArrayView<23ul>
              ((QByteArrayView *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (char (*) [23])CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    QVar5.m_data = local_78;
    QVar5.m_size = (qsizetype)local_68;
    QString::fromLatin1(QVar5);
    DomColor::elementRed(in_RSI);
    QChar::QChar<char16_t,_true>(&local_7a,L' ');
    QString::arg<int,_true>
              ((QString *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               in_stack_fffffffffffffee4,in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,QVar7);
    DomColor::elementGreen(in_RSI);
    QChar::QChar<char16_t,_true>(&local_7c,L' ');
    QString::arg<int,_true>
              ((QString *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               in_stack_fffffffffffffee4,in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,QVar7);
    DomColor::elementBlue(in_RSI);
    QChar::QChar<char16_t,_true>(&local_7e,L' ');
    QString::arg<int,_true>
              ((QString *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               in_stack_fffffffffffffee4,in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,QVar7);
    iVar2 = DomColor::attributeAlpha(in_RSI);
    QVar7.ucs = (char16_t)((uint)iVar2 >> 0x10);
    QChar::QChar<char16_t,_true>(&local_80,L' ');
    QString::arg<int,_true>
              ((QString *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               in_stack_fffffffffffffee4,in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,QVar7);
    QString::~QString((QString *)0x139989);
    QString::~QString((QString *)0x139996);
    QString::~QString((QString *)0x1399a3);
    QString::~QString((QString *)0x1399b0);
  }
  else {
    QByteArrayView::QByteArrayView<19ul>
              ((QByteArrayView *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (char (*) [19])CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    QVar6.m_data = local_d8;
    QVar6.m_size = (qsizetype)local_c8;
    QString::fromLatin1(QVar6);
    iVar2 = DomColor::elementRed(in_RSI);
    QChar::QChar<char16_t,_true>(&local_da,L' ');
    QString::arg<int,_true>
              ((QString *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),iVar2,
               in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,QVar7);
    iVar3 = DomColor::elementGreen(in_RSI);
    QChar::QChar<char16_t,_true>(&local_dc,L' ');
    QString::arg<int,_true>
              ((QString *)CONCAT44(in_stack_fffffffffffffeec,iVar3),iVar2,in_stack_fffffffffffffee0,
               in_stack_fffffffffffffedc,QVar7);
    iVar4 = DomColor::elementBlue(in_RSI);
    QChar::QChar<char16_t,_true>(&local_de,L' ');
    QString::arg<int,_true>
              ((QString *)CONCAT44(iVar4,iVar3),iVar2,in_stack_fffffffffffffee0,
               in_stack_fffffffffffffedc,QVar7);
    QString::~QString((QString *)0x139aa7);
    QString::~QString((QString *)0x139ab1);
    QString::~QString((QString *)0x139abb);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString WriteInitialization::domColor2QString(const DomColor *c)
{
    if (c->hasAttributeAlpha())
        return QString::fromLatin1("QColor(%1, %2, %3, %4)")
            .arg(c->elementRed())
            .arg(c->elementGreen())
            .arg(c->elementBlue())
            .arg(c->attributeAlpha());
    return QString::fromLatin1("QColor(%1, %2, %3)")
        .arg(c->elementRed())
        .arg(c->elementGreen())
        .arg(c->elementBlue());
}